

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O1

void default_shutdown(exr_const_context_t_conflict c,void *userdata,int failed)

{
  _internal_exr_filehandle *fh;
  
  if ((userdata != (void *)0x0) && (-1 < *userdata)) {
    close(*userdata);
    return;
  }
  return;
}

Assistant:

static void
default_shutdown (exr_const_context_t c, void* userdata, int failed)
{
    /* we will handle failure before here */
    struct _internal_exr_filehandle* fh = userdata;
    if (fh)
    {
        if (fh->fd >= 0) close (fh->fd);
#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
        pthread_mutex_destroy (&(fh->mutex));
#    endif
#endif
    }
    (void) c;
    (void) failed;
}